

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  string *psVar1;
  OfType OVar2;
  pointer pMVar3;
  undefined8 this_00;
  ostream *poVar4;
  XmlWriter *this_01;
  pointer pMVar5;
  undefined1 local_208 [8];
  ostringstream oss;
  size_type *local_90;
  string elementName;
  ScopedElement local_68;
  ScopedElement e;
  pointer local_58;
  allocator<char> local_31;
  
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if (((OVar2 & FailureBit) != Ok) &&
     (((stats->assertionResult).m_info.resultDisposition & SuppressFail) == 0)) {
    local_90 = &elementName._M_string_length;
    elementName._M_dataplus._M_p = (pointer)0x0;
    elementName._M_string_length._0_1_ = 0;
    if ((((uint)(OVar2 + ~FailureBit) < 2) ||
        (((OVar2 == Unknown || (OVar2 == FailureBit)) || (OVar2 == Exception)))) ||
       (((OVar2 == FatalErrorCondition || (OVar2 == DidntThrowException)) ||
        (OVar2 == ThrewException)))) {
      std::__cxx11::string::assign((char *)&local_90);
    }
    this_01 = &this->xml;
    XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)this_01);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_208,"message",&local_31);
    std::__cxx11::string::string((string *)&e,(string *)&(stats->assertionResult).m_resultData);
    XmlWriter::writeAttribute(this_01,(string *)local_208,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_208,"type",&local_31);
    std::__cxx11::string::string((string *)&e,(string *)&stats->assertionResult);
    XmlWriter::writeAttribute(this_01,(string *)local_208,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    psVar1 = &(stats->assertionResult).m_resultData.message;
    std::__cxx11::string::string((string *)&e,(string *)psVar1);
    std::__cxx11::string::~string((string *)&e);
    if (local_58 != (pointer)0x0) {
      std::__cxx11::string::string((string *)&e,(string *)psVar1);
      poVar4 = std::operator<<((ostream *)local_208,(string *)&e);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&e);
    }
    pMVar3 = (stats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    elementName.field_2._8_8_ = this_01;
    for (pMVar5 = (stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar3; pMVar5 = pMVar5 + 1) {
      if (pMVar5->type == Info) {
        poVar4 = std::operator<<((ostream *)local_208,(string *)&pMVar5->message);
        std::operator<<(poVar4,"\n");
      }
    }
    poVar4 = std::operator<<((ostream *)local_208,"at ");
    SourceLineInfo::SourceLineInfo((SourceLineInfo *)&e,&(stats->assertionResult).m_info.lineInfo);
    this_00 = elementName.field_2._8_8_;
    operator<<(poVar4,(SourceLineInfo *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::stringbuf::str();
    XmlWriter::writeText((XmlWriter *)this_00,(string *)&e,false);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
    XmlWriter::ScopedElement::~ScopedElement(&local_68);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void writeAssertion( AssertionStats const& stats ) {
            AssertionResult const& result = stats.assertionResult;
            if( !result.isOk() ) {
                std::string elementName;
                switch( result.getResultType() ) {
                    case ResultWas::ThrewException:
                    case ResultWas::FatalErrorCondition:
                        elementName = "error";
                        break;
                    case ResultWas::ExplicitFailure:
                        elementName = "failure";
                        break;
                    case ResultWas::ExpressionFailed:
                        elementName = "failure";
                        break;
                    case ResultWas::DidntThrowException:
                        elementName = "failure";
                        break;

                    // We should never see these here:
                    case ResultWas::Info:
                    case ResultWas::Warning:
                    case ResultWas::Ok:
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        elementName = "internalError";
                        break;
                }

                XmlWriter::ScopedElement e = xml.scopedElement( elementName );

                xml.writeAttribute( "message", result.getExpandedExpression() );
                xml.writeAttribute( "type", result.getTestMacroName() );

                std::ostringstream oss;
                if( !result.getMessage().empty() )
                    oss << result.getMessage() << "\n";
                for( std::vector<MessageInfo>::const_iterator
                        it = stats.infoMessages.begin(),
                        itEnd = stats.infoMessages.end();
                            it != itEnd;
                            ++it )
                    if( it->type == ResultWas::Info )
                        oss << it->message << "\n";

                oss << "at " << result.getSourceInfo();
                xml.writeText( oss.str(), false );
            }
        }